

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdtext.c
# Opt level: O3

int cueify_cdtext_deserialize(cueify_cdtext *t,uint8_t *buffer,size_t size)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  byte *pbVar4;
  ushort *puVar5;
  long lVar6;
  byte *pbVar7;
  void *pvVar8;
  char *pcVar9;
  char *pcVar10;
  size_t sVar11;
  char *pcVar12;
  uint uVar13;
  long lVar14;
  cueify_cdtext *ppvVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  byte *pbVar19;
  ushort uVar20;
  cueify_cdtext_private *cdtext;
  long lVar21;
  ulong uVar22;
  byte *pbVar23;
  long lVar24;
  ulong *__s;
  uchar *pack_data [8] [16];
  size_t pack_sizes [8] [16];
  cueify_cdtext *local_8c0;
  cueify_cdtext local_838 [128];
  ulong local_438 [129];
  
  iVar17 = 3;
  if (buffer != (uint8_t *)0x0 && t != (cueify_cdtext *)0x0) {
    iVar17 = 6;
    if ((3 < size) &&
       (uVar20 = *(ushort *)buffer << 8 | *(ushort *)buffer >> 8, iVar17 = 6,
       (ulong)uVar20 <= size - 2)) {
      uVar13 = (uint)uVar20 * 0x38e38e39 + 0x9c71c71c;
      iVar17 = 7;
      if ((uVar13 >> 1 | (uint)((uVar13 & 1) != 0) << 0x1f) < 0xe38e38f) {
        local_8c0 = local_838;
        memset(local_8c0,0,0x400);
        __s = local_438;
        memset(__s,0,0x400);
        ppvVar15 = t + 0x2be;
        lVar24 = 0;
        do {
          lVar21 = 0;
          do {
            free(*(void **)((long)ppvVar15 + lVar21 + -0x15e0));
            *(undefined8 *)((long)ppvVar15 + lVar21 + -0x15e0) = 0;
            free(*(void **)((long)ppvVar15 + lVar21 + -0x12c0));
            *(undefined8 *)((long)ppvVar15 + lVar21 + -0x12c0) = 0;
            free(*(void **)((long)ppvVar15 + lVar21 + -4000));
            *(undefined8 *)((long)ppvVar15 + lVar21 + -4000) = 0;
            free(*(void **)((long)ppvVar15 + lVar21 + -0xc80));
            *(undefined8 *)((long)ppvVar15 + lVar21 + -0xc80) = 0;
            free(*(void **)((long)ppvVar15 + lVar21 + -0x960));
            *(undefined8 *)((long)ppvVar15 + lVar21 + -0x960) = 0;
            free(*(void **)((long)ppvVar15 + lVar21 + -0x640));
            *(undefined8 *)((long)ppvVar15 + lVar21 + -0x640) = 0;
            free(*(void **)((long)ppvVar15 + lVar21 + -800));
            *(undefined8 *)((long)ppvVar15 + lVar21 + -800) = 0;
            free(*(void **)((long)ppvVar15 + lVar21));
            *(undefined8 *)((long)ppvVar15 + lVar21) = 0;
            pvVar8 = *(void **)((long)t + lVar21 + 0x1910);
            if (pvVar8 != (void *)0x0) {
              free(pvVar8);
              *(undefined8 *)((long)t + lVar21 + 0x1910) = 0;
            }
            pvVar8 = *(void **)((long)t + lVar21 + 0x1920);
            if (pvVar8 != (void *)0x0) {
              free(pvVar8);
              *(undefined8 *)((long)t + lVar21 + 0x1920) = 0;
            }
            lVar21 = lVar21 + 0x1928;
          } while (lVar21 != 0xc940);
          free(t[lVar24 + 0x195b]);
          t[lVar24 + 0x195b] = (cueify_cdtext)0x0;
          *(undefined1 *)((long)t + lVar24 + 0xca6e) = 0;
          lVar24 = lVar24 + 1;
          ppvVar15 = ppvVar15 + 1;
        } while (lVar24 != 100);
        pbVar19 = buffer + 4;
        pbVar23 = buffer + (int)(uVar20 - 2);
        pbVar7 = pbVar19;
        if (6 < uVar20) {
          do {
            if ((-1 < (char)pbVar7[1]) && ((char)*pbVar7 < -0x70)) {
              local_438[(ulong)(pbVar7[3] & 0x70) + (ulong)(*pbVar7 & 0xf)] =
                   local_438[(ulong)(pbVar7[3] & 0x70) + (ulong)(*pbVar7 & 0xf)] + 0xc;
            }
            pbVar7 = pbVar7 + 0x12;
          } while (pbVar7 < pbVar23);
        }
        lVar24 = 0;
        do {
          lVar21 = 0;
          do {
            if (__s[lVar21] != 0) {
              pvVar8 = malloc(__s[lVar21]);
              local_8c0[lVar21] = pvVar8;
              if (pvVar8 == (void *)0x0) goto LAB_0014ec13;
              __s[lVar21] = 0;
            }
            lVar21 = lVar21 + 1;
          } while (lVar21 != 0x10);
          lVar24 = lVar24 + 1;
          __s = __s + 0x10;
          local_8c0 = local_8c0 + 0x10;
        } while (lVar24 != 8);
        pbVar7 = pbVar19;
        if (6 < uVar20) {
          do {
            if ((-1 < (char)pbVar7[1]) && ((char)*pbVar7 < -0x70)) {
              uVar22 = (ulong)((*pbVar7 & 0xf) << 3);
              uVar16 = (ulong)((pbVar7[3] & 0x70) << 3);
              lVar24 = *(long *)((long)local_838 + uVar22 + uVar16);
              lVar6 = uVar16 - 0x438;
              lVar21 = *(long *)((long)local_438 + uVar22 + lVar6 + 0x438);
              *(undefined4 *)(lVar24 + 8 + lVar21) = *(undefined4 *)(pbVar7 + 0xc);
              *(undefined8 *)(lVar24 + lVar21) = *(undefined8 *)(pbVar7 + 4);
              *(long *)((long)local_438 + uVar22 + lVar6 + 0x438) = lVar21 + 0xc;
            }
            pbVar7 = pbVar7 + 0x12;
          } while (pbVar7 < pbVar23);
        }
        pbVar7 = (byte *)((long)t + 0xc);
        lVar24 = 0x78;
        lVar21 = 0;
        do {
          if (*(long *)((long)local_438 + lVar24) == 0x24) {
            pbVar7[-0xc] = 1;
            pbVar7[-0xb] = 0;
            pbVar7[-10] = 0;
            pbVar7[-9] = 0;
            pbVar4 = *(byte **)((long)local_838 + lVar24);
            pbVar7[-8] = *pbVar4;
            pbVar7[-7] = pbVar4[lVar21 + 0x1c];
            pbVar7[-6] = pbVar4[1];
            pbVar7[-5] = pbVar4[2];
            pbVar7[-4] = pbVar4[3] >> 7;
            pbVar7[-3] = pbVar4[3] >> 6 & 1;
            pbVar7[-2] = pbVar4[3] >> 2 & 1;
            pbVar7[-1] = pbVar4[3] >> 1 & 1;
            *pbVar7 = pbVar4[3] & 1;
          }
          lVar21 = lVar21 + 1;
          pbVar7 = pbVar7 + 0x1928;
          lVar24 = lVar24 + 0x80;
        } while (lVar21 != 8);
        lVar24 = 0;
        do {
          lVar21 = lVar24 * 0x1928;
          uVar22 = 0;
          do {
            uVar16 = local_438[lVar24 * 0x10 + uVar22];
            if ((uVar16 != 0) && ((uint)uVar22 < 0xf)) {
              iVar17 = (int)uVar16;
              switch(uVar22 & 0xffffffff) {
              default:
                bVar2 = *(byte *)((long)t + lVar21 + 4);
                if (bVar2 < 2) {
                  pcVar9 = latin1_to_utf8((uint8_t *)local_838[lVar24 * 0x10 + uVar22],iVar17);
LAB_0014e914:
                  if (pcVar9 == (char *)0x0) goto LAB_0014ec13;
                }
                else {
                  if (bVar2 == 0x80) {
                    pcVar9 = msjis_to_utf8((uint8_t *)local_838[lVar24 * 0x10 + uVar22],
                                           (int)(uVar16 >> 1));
                    goto LAB_0014e914;
                  }
                  pcVar9 = (char *)0x0;
                }
                switch(uVar22 & 0xffffffff) {
                case 0:
                  local_8c0 = t + lVar24 * 0x325 + 2;
                  break;
                case 1:
                  local_8c0 = t + lVar24 * 0x325 + 0x66;
                  break;
                case 2:
                  local_8c0 = t + lVar24 * 0x325 + 0xca;
                  break;
                case 3:
                  local_8c0 = t + lVar24 * 0x325 + 0x12e;
                  break;
                case 4:
                  local_8c0 = t + lVar24 * 0x325 + 0x192;
                  break;
                case 5:
                  local_8c0 = t + lVar24 * 0x325 + 0x1f6;
                  break;
                case 0xd:
                  local_8c0 = t + lVar24 * 0x325 + 0x25a;
                  break;
                case 0xe:
                  local_8c0 = t + lVar24 * 0x325 + 0x2be;
                }
                if (pcVar9 != (char *)0x0) {
                  pcVar10 = strdup(pcVar9);
                  *local_8c0 = pcVar10;
                  if (pcVar10 == (char *)0x0) goto LAB_0014ec13;
                  bVar2 = *(byte *)((long)t + lVar21 + 6);
                  uVar16 = (ulong)bVar2;
                  bVar1 = *(byte *)((long)t + lVar21 + 7);
                  if (bVar2 <= bVar1) {
                    pcVar10 = pcVar9;
                    do {
                      sVar11 = strlen(pcVar10);
                      pcVar10 = pcVar10 + sVar11 + 1;
                      pcVar12 = strdup(pcVar10);
                      local_8c0[uVar16] = pcVar12;
                      if (pcVar12 == (char *)0x0) goto LAB_0014ec13;
                      uVar16 = uVar16 + 1;
                    } while ((ulong)bVar1 + 1 != uVar16);
                  }
                  free(pcVar9);
                }
                break;
              case 6:
                pcVar9 = latin1_to_utf8((uint8_t *)local_838[lVar24 * 0x10 + uVar22],iVar17);
                t[lVar24 * 0x325 + 0x322] = pcVar9;
                break;
              case 7:
                puVar5 = (ushort *)local_838[lVar24 * 0x10 + uVar22];
                uVar3 = *puVar5;
                *(ushort *)(t + lVar24 * 0x325 + 0x323) = uVar3 << 8 | uVar3 >> 8;
                pcVar9 = latin1_to_utf8((uint8_t *)(puVar5 + 1),iVar17 + -2);
                t[lVar24 * 0x325 + 0x324] = pcVar9;
                break;
              case 8:
                pbVar7 = (byte *)local_838[lVar24 * 0x10 + uVar22];
                bVar2 = *pbVar7;
                *(byte *)(t + 0x1928) = bVar2;
                bVar1 = pbVar7[1];
                *(byte *)((long)t + 0xc941) = bVar1;
                *(byte *)((long)t + 0xc942) = pbVar7[3];
                *(byte *)((long)t + 0xc943) = pbVar7[4];
                *(byte *)((long)t + 0xc944) = pbVar7[5];
                if (bVar2 <= bVar1) {
                  lVar14 = ((ulong)bVar1 - (ulong)bVar2) + 1;
                  lVar6 = (ulong)bVar2 * 3;
                  lVar18 = 0;
                  do {
                    *(byte *)((long)t + lVar18 + lVar6 + 0xc942) = pbVar7[lVar18 + 0xc];
                    *(byte *)((long)t + lVar18 + lVar6 + 0xc943) = pbVar7[lVar18 + 0xd];
                    *(byte *)((long)t + lVar18 + lVar6 + 0xc944) = pbVar7[lVar18 + 0xe];
                    lVar18 = lVar18 + 3;
                    lVar14 = lVar14 + -1;
                  } while (lVar14 != 0);
                }
                break;
              case 9:
              case 10:
              case 0xb:
              case 0xc:
                break;
              }
            }
            uVar22 = uVar22 + 1;
          } while (uVar22 != 0x10);
          lVar24 = lVar24 + 1;
        } while (lVar24 != 8);
        if (6 < uVar20) {
          do {
            lVar24 = (long)(char)pbVar19[1];
            if ((-1 < lVar24) && (*pbVar19 == 0x89)) {
              bVar2 = pbVar19[5];
              *(byte *)((long)t + lVar24 + 0xca6e) = bVar2;
              pvVar8 = t[lVar24 + 0x195b];
              if (pvVar8 == (void *)0x0) {
                pvVar8 = malloc((ulong)((uint)bVar2 * 2) * 3);
                t[lVar24 + 0x195b] = pvVar8;
                if (pvVar8 == (void *)0x0) {
LAB_0014ec13:
                  ppvVar15 = local_838;
                  lVar24 = 0;
                  do {
                    lVar21 = 0;
                    do {
                      free(ppvVar15[lVar21]);
                      lVar21 = lVar21 + 1;
                    } while (lVar21 != 0x10);
                    lVar24 = lVar24 + 1;
                    ppvVar15 = ppvVar15 + 0x10;
                  } while (lVar24 != 8);
                  return 4;
                }
              }
              *(byte *)((long)pvVar8 + (ulong)pbVar19[4] * 6 + -6) = pbVar19[10];
              *(byte *)((long)pvVar8 + (ulong)pbVar19[4] * 6 + -5) = pbVar19[0xb];
              *(byte *)((long)pvVar8 + (ulong)pbVar19[4] * 6 + -4) = pbVar19[0xc];
              *(byte *)((long)pvVar8 + (ulong)pbVar19[4] * 6 + -3) = pbVar19[0xd];
              *(byte *)((long)pvVar8 + (ulong)pbVar19[4] * 6 + -2) = pbVar19[0xe];
              *(byte *)((long)pvVar8 + (ulong)pbVar19[4] * 6 + -1) = pbVar19[0xf];
            }
            pbVar19 = pbVar19 + 0x12;
          } while (pbVar19 < pbVar23);
        }
        ppvVar15 = local_838;
        lVar24 = 0;
        do {
          lVar21 = 0;
          do {
            free(ppvVar15[lVar21]);
            lVar21 = lVar21 + 1;
          } while (lVar21 != 0x10);
          lVar24 = lVar24 + 1;
          ppvVar15 = ppvVar15 + 0x10;
          iVar17 = 0;
        } while (lVar24 != 8);
      }
    }
  }
  return iVar17;
}

Assistant:

int cueify_cdtext_deserialize(cueify_cdtext *t, const uint8_t * const buffer,
			      size_t size) {
    cueify_cdtext_private *cdtext = (cueify_cdtext_private *)t;
    uint16_t toc_length;
    const uint8_t *bp;
    int block, pack_type, track;
    unsigned char *pack_data[MAX_BLOCKS][16];
    unsigned char *pack;
    size_t pack_sizes[MAX_BLOCKS][16];
    size_t pack_size;
    struct cdtext_descriptor *descriptor;

    if (t == NULL || buffer == NULL) {
	return CUEIFY_ERR_BADARG;
    }
    if (size < 4) {
	return CUEIFY_ERR_TRUNCATED;
    }

    /* CD-TEXT Data Length */
    toc_length = ((buffer[0] << 8) | buffer[1]);
    if (size - 2 < toc_length) {
	return CUEIFY_ERR_TRUNCATED;
    }
    if ((toc_length - 2) % 18 != 0) {
	return CUEIFY_ERR_CORRUPTED;
    }

    /* Reserved */

    /* Zero out the pack data. */
    for (block = 0; block < MAX_BLOCKS; block++) {
	for (pack_type = 0; pack_type < 16; pack_type++) {
	    pack_data[block][pack_type] = NULL;
	    pack_sizes[block][pack_type] = 0;
	}
    }

    /* Zero out the cdtext data (so it can be freed) */
    for (track = 0; track < MAX_TRACKS; track++) {
	for (block = 0; block < MAX_BLOCKS; block++) {
	    free(cdtext->blocks[block].titles[track]);
	    cdtext->blocks[block].titles[track] = NULL;
	    free(cdtext->blocks[block].performers[track]);
	    cdtext->blocks[block].performers[track] = NULL;
	    free(cdtext->blocks[block].songwriters[track]);
	    cdtext->blocks[block].songwriters[track] = NULL;
	    free(cdtext->blocks[block].composers[track]);
	    cdtext->blocks[block].composers[track] = NULL;
	    free(cdtext->blocks[block].arrangers[track]);
	    cdtext->blocks[block].arrangers[track] = NULL;
	    free(cdtext->blocks[block].messages[track]);
	    cdtext->blocks[block].messages[track] = NULL;
	    free(cdtext->blocks[block].private[track]);
	    cdtext->blocks[block].private[track] = NULL;
	    free(cdtext->blocks[block].upc_isrcs[track]);
	    cdtext->blocks[block].upc_isrcs[track] = NULL;
	    if (cdtext->blocks[block].discid != NULL) {
		free(cdtext->blocks[block].discid);
		cdtext->blocks[block].discid = NULL;
	    }
	    if (cdtext->blocks[block].genre_name != NULL) {
		free(cdtext->blocks[block].genre_name);
		cdtext->blocks[block].genre_name = NULL;
	    }
	}

	free(cdtext->toc.intervals[track]);
	cdtext->toc.intervals[track] = NULL;
	cdtext->toc.num_intervals[track] = 0;
    }

    /* Count all of the PACKs by BLOCK, so we know how much space to
     * allocate. */
    for (bp = buffer + 4; bp < buffer + (toc_length - 2); bp += 18) {
	descriptor = (struct cdtext_descriptor *)bp;

	/* Ignore extension blocks. */
	if (EXTENSION_FLAG(descriptor->track_number) ||
	    descriptor->pack_type < 0x80 ||
	    descriptor->pack_type > 0x8F) {
	    continue;
	}

	pack_sizes[BLOCK_NUMBER(descriptor->block_number)]
	    [descriptor->pack_type - 0x80] += 12;
    }

    /* Allocate the aggregate PACK space. */
    for (block = 0; block < MAX_BLOCKS; block++) {
	for (pack_type = 0; pack_type < 16; pack_type++) {
	    if (pack_sizes[block][pack_type] > 0) {
		pack_data[block][pack_type] =
		    malloc(pack_sizes[block][pack_type]);
		if (pack_data[block][pack_type] == NULL) {
		    goto error;
		}
		/* Reset the size count, so that we can use it as a pointer. */
		pack_sizes[block][pack_type] = 0;
	    }
	}
    }

    /* Aggregate all PACKs. */
    /* NOTE: We assume that PACKs in a given PACK type are in order!! */
    for (bp = buffer + 4; bp < buffer + (toc_length - 2); bp += 18) {
	descriptor = (struct cdtext_descriptor *)bp;

	/* Ignore extension blocks. */
	if (EXTENSION_FLAG(descriptor->track_number) ||
	    descriptor->pack_type < 0x80 ||
	    descriptor->pack_type > 0x8F) {
	    continue;
	}

	block = BLOCK_NUMBER(descriptor->block_number);
	pack_type = descriptor->pack_type - 0x80;

	pack = pack_data[block][pack_type];
	pack_size = pack_sizes[block][pack_type];
	memcpy(pack + pack_size, descriptor->data, 12);
	pack_sizes[block][pack_type] += 12;
	/* TODO: Check CRC */
    }

    /*
     * Now that we have collected all of the PACKs by BLOCK and type,
     * parse the size information PACKs to get the character code,
     * track, and language code info.
     */
    for (block = 0; block < MAX_BLOCKS; block++) {
	/* Don't know how to handle any other size of the size
	 * information block! */
	if (pack_sizes[block][15] != 36) {
	    continue;
	}

	cdtext->blocks[block].valid = 1;
	cdtext->blocks[block].charset = pack_data[block][15][0];
	/* NOTE: This might not work if the language codes aren't in
	 * EVERY info block */
	cdtext->blocks[block].language = pack_data[block][15][block + 28];
	cdtext->blocks[block].first_track_number = pack_data[block][15][1];
	cdtext->blocks[block].last_track_number = pack_data[block][15][2];
	cdtext->blocks[block].program_cdtext =
	    (pack_data[block][15][3] >> 7) & 1;
	cdtext->blocks[block].program_copyright =
	    (pack_data[block][15][3] >> 6) & 1;
	cdtext->blocks[block].message_copyright =
	    (pack_data[block][15][3] >> 2) & 1;
	cdtext->blocks[block].name_copyright =
	    (pack_data[block][15][3] >> 1) & 1;
	cdtext->blocks[block].title_copyright =
	    (pack_data[block][15][3]) & 1;
    }

    for (block = 0; block < MAX_BLOCKS; block++) {
	for (pack_type = 0; pack_type < 16; pack_type++) {
	    if (pack_sizes[block][pack_type] > 0) {
		char **datum;
		char *data = NULL, *data_ptr = NULL;

		switch (pack_type) {
		case 0:   /* 0x80 = TITLE */
		case 1:   /* 0x81 = PERFORMER */
		case 2:   /* 0x82 = SONGWRITER */
		case 3:   /* 0x83 = COMPOSER */
		case 4:   /* 0x84 = ARRANGER */
		case 5:   /* 0x85 = MESSAGE */
		case 13:  /* 0x8D = PRIVATE */
		case 14:  /* 0x8E = UPC/ISRC */
		    /* Textual track-wise PACKs. */

		    /* Decode the PACK contents. */
		    data = NULL;
		    switch (cdtext->blocks[block].charset) {
		    case CUEIFY_CDTEXT_CHARSET_ASCII:
		    case CUEIFY_CDTEXT_CHARSET_ISO8859_1:
			data = latin1_to_utf8(pack_data[block][pack_type],
					      pack_sizes[block][pack_type]);
			if (data == NULL) {
			    goto error;
			}
			break;
		    case CUEIFY_CDTEXT_CHARSET_MSJIS:
			/* NOTE: MS-JIS is a two-byte encoding. */
			data = msjis_to_utf8(pack_data[block][pack_type],
					     pack_sizes[block][pack_type] / 2);
			if (data == NULL) {
			    goto error;
			}
			break;
		    default:
			/* Ignore! */
			break;
		    }

		    /* Split data by track. */
		    switch (pack_type) {
		    case 0:   /* 0x80 = TITLE */
			datum = cdtext->blocks[block].titles;
			break;
		    case 1:   /* 0x81 = PERFORMER */
			datum = cdtext->blocks[block].performers;
			break;
		    case 2:   /* 0x82 = SONGWRITER */
			datum = cdtext->blocks[block].songwriters;
			break;
		    case 3:   /* 0x83 = COMPOSER */
			datum = cdtext->blocks[block].composers;
			break;
		    case 4:   /* 0x84 = ARRANGER */
			datum = cdtext->blocks[block].arrangers;
			break;
		    case 5:   /* 0x85 = MESSAGE */
			datum = cdtext->blocks[block].messages;
			break;
		    /* NOTE: 0x8D/0x8E probably break in MS-JIS!! */
		    case 13:  /* 0x8D = PRIVATE */
			datum = cdtext->blocks[block].private;
			break;
		    case 14:  /* 0x8E = UPC/ISRC */
			datum = cdtext->blocks[block].upc_isrcs;
			break;
		    default:
			break;
		    }

		    /* Copy the decoded text */
		    /* NOTE: This is probably broken for things which
		     * skip tracks. */
		    if (data != NULL) {
			data_ptr = data;
			/* First do the album-wide value. */
			datum[0] = strdup(data_ptr);
			if (datum[0] == NULL) {
			    /* Failed to strdup */
			    goto error;
			}
			/* NOTE: We assume all tracks are included! */
			for (track = cdtext->blocks[block].first_track_number;
			     track <= cdtext->blocks[block].last_track_number;
			     track++) {
			    /* Skip to next track entry. */
			    data_ptr += strlen(data_ptr) + 1;
			    datum[track] = strdup(data_ptr);
			    if (datum[track] == NULL) {
				/* Failed to strdup */
				goto error;
			    }
			}

			/* All done with the decoded value. We can free it. */
			free(data);
		    }
		    break;
		case 6:   /* 0x86 = DISCID */
		    /* According to Red Book, only ISO 8859-1 may be used. */
		    cdtext->blocks[block].discid =
			latin1_to_utf8(pack_data[block][pack_type],
				       pack_sizes[block][pack_type]);
		    break;
		case 7:   /* 0x87 = GENRE */
		    /* Genre includes a genre code in addition to text. */
		    cdtext->blocks[block].genre_code =
			((uint16_t)pack_data[block][pack_type][0] << 8) |
			((uint16_t)pack_data[block][pack_type][1]);
		    /* No particular reason to believe this is Latin1 only?? */
		    cdtext->blocks[block].genre_name =
			latin1_to_utf8(pack_data[block][pack_type] + 2,
				       pack_sizes[block][pack_type] - 2);
		    break;
		case 8:   /* 0x88 = TOCINFO */
		    /* This basically encodes another (short) TOC. */
		    /* NOTE: We assume that the TOC only occurs once. */
		    cdtext->toc.first_track_number =
			pack_data[block][pack_type][0];
		    cdtext->toc.last_track_number =
			pack_data[block][pack_type][1];
		    cdtext->toc.offsets[0].min =
			pack_data[block][pack_type][3];
		    cdtext->toc.offsets[0].sec =
			pack_data[block][pack_type][4];
		    cdtext->toc.offsets[0].frm =
			pack_data[block][pack_type][5];
		    /* NOTE: We assume that the tracks are contiguous
		     * in increasing order. */
		    for (track = cdtext->toc.first_track_number;
			 track <= cdtext->toc.last_track_number;
			 track++) {
			cdtext->toc.offsets[track].min =
			    pack_data[block][pack_type]
			    [12+(track - cdtext->toc.first_track_number)*3];
			cdtext->toc.offsets[track].sec =
			    pack_data[block][pack_type]
			    [12+(track - cdtext->toc.first_track_number)*3+1];
			cdtext->toc.offsets[track].frm =
			    pack_data[block][pack_type]
			    [12+(track - cdtext->toc.first_track_number)*3+2];
		    }
		    break;
		case 9:   /* 0x89 = TOCINFO2 */
		    /* Need the track number from the PACK, so we
		     * ignore and handle later. */
		case 15:  /* 0x8F = SIZEINFO */
		default:
		    /* Ignore! */
		    break;
		}
	    }
	}
    }

    /* Finally, we go back and do the TOCINFO2 packets. */
    for (bp = buffer + 4; bp < buffer + (toc_length - 2); bp += 18) {
	descriptor = (struct cdtext_descriptor *)bp;

	/* Ignore extension blocks. */
	if (EXTENSION_FLAG(descriptor->track_number) ||
	    descriptor->pack_type < 0x80 ||
	    descriptor->pack_type > 0x8F) {
	    continue;
	}

	block = BLOCK_NUMBER(descriptor->block_number);
	pack_type = descriptor->pack_type;

	/* NOTE: We assume that the TOC-2 only occurs once. */
	if (pack_type == 0x89) {
	    track = TRACK_NUMBER(descriptor->track_number);

	    cdtext->toc.num_intervals[track] = descriptor->data[1];
	    if (cdtext->toc.intervals[track] == NULL) {
		cdtext->toc.intervals[track] =
		    malloc(cdtext->toc.num_intervals[track] *
			   sizeof(cueify_cdtext_toc_track_interval_private));
		if (cdtext->toc.intervals[track] == NULL) {
		    goto error;
		}
	    }

	    cdtext->toc.intervals[track][descriptor->data[0] - 1].start.min =
		descriptor->data[6];
	    cdtext->toc.intervals[track][descriptor->data[0] - 1].start.sec =
		descriptor->data[7];
	    cdtext->toc.intervals[track][descriptor->data[0] - 1].start.frm =
		descriptor->data[8];
	    cdtext->toc.intervals[track][descriptor->data[0] - 1].end.min =
		descriptor->data[9];
	    cdtext->toc.intervals[track][descriptor->data[0] - 1].end.sec =
		descriptor->data[10];
	    cdtext->toc.intervals[track][descriptor->data[0] - 1].end.frm =
		descriptor->data[11];
	}
    }

    for (block = 0; block < MAX_BLOCKS; block++) {
	for (pack_type = 0; pack_type < 16; pack_type++) {
	    free(pack_data[block][pack_type]);
	}
    }

    return CUEIFY_OK;

error:
    for (block = 0; block < MAX_BLOCKS; block++) {
	for (pack_type = 0; pack_type < 16; pack_type++) {
	    free(pack_data[block][pack_type]);
	}
    }

    /* Almost always a memory error. */
    return CUEIFY_ERR_NOMEM;
}